

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QSizePolicy *p)

{
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QDebug local_60;
  undefined1 local_58 [8];
  QDebug local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)p);
  *(undefined1 *)(*(long *)p + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)p,"QSizePolicy(horizontalPolicy = ");
  local_60.stream = pQVar3->stream;
  *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
  operator<<((Stream *)local_58,(Policy)&local_60);
  pQVar3 = QDebug::operator<<((QDebug *)local_58,", verticalPolicy = ");
  local_50.stream = pQVar3->stream;
  *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
  operator<<((Stream *)local_48,(Policy)&local_50);
  QDebug::operator<<((QDebug *)local_48,')');
  QDebug::~QDebug((QDebug *)local_48);
  QDebug::~QDebug(&local_50);
  QDebug::~QDebug((QDebug *)local_58);
  QDebug::~QDebug(&local_60);
  uVar2 = *(undefined8 *)p;
  *(undefined8 *)p = 0;
  *(undefined8 *)dbg.stream = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSizePolicy &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QSizePolicy(horizontalPolicy = " << p.horizontalPolicy()
                  << ", verticalPolicy = " << p.verticalPolicy() << ')';
    return dbg;
}